

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseAttValueInternal(xmlParserCtxtPtr ctxt,int *len,int *alloc,int normalize)

{
  xmlChar xVar1;
  xmlChar xVar2;
  int iVar3;
  xmlChar *pxVar4;
  long lVar5;
  xmlChar *pxVar6;
  bool bVar7;
  ptrdiff_t delta_4;
  xmlChar *oldbase_4;
  ptrdiff_t delta_3;
  xmlChar *oldbase_3;
  ptrdiff_t delta_2;
  xmlChar *oldbase_2;
  ptrdiff_t delta_1;
  xmlChar *oldbase_1;
  ptrdiff_t delta;
  xmlChar *oldbase;
  int col;
  int line;
  xmlChar *ret;
  xmlChar *last;
  xmlChar *end;
  xmlChar *start;
  xmlChar *in;
  xmlChar limit;
  int normalize_local;
  int *alloc_local;
  int *len_local;
  xmlParserCtxtPtr ctxt_local;
  
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar6 = ctxt->input->cur;
  oldbase._4_4_ = ctxt->input->line;
  iVar3 = ctxt->input->col;
  if ((*pxVar6 != '\"') && (*pxVar6 != '\'')) {
    xmlFatalErr(ctxt,XML_ERR_ATTRIBUTE_NOT_STARTED,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;
  start = pxVar6 + 1;
  xVar1 = *pxVar6;
  oldbase._0_4_ = iVar3 + 1;
  last = ctxt->input->end;
  if (last <= start) {
    pxVar6 = ctxt->input->base;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      return (xmlChar *)0x0;
    }
    if (pxVar6 != ctxt->input->base) {
      start = start + ((long)ctxt->input->base - (long)pxVar6);
    }
    last = ctxt->input->end;
  }
  end = start;
  if (normalize == 0) {
    while( true ) {
      bVar7 = false;
      if ((((start < last) && (bVar7 = false, *start != xVar1)) && (bVar7 = false, 0x1f < *start))
         && ((bVar7 = false, *start < 0x80 && (bVar7 = false, *start != '&')))) {
        bVar7 = *start != '<';
      }
      if (!bVar7) break;
      start = start + 1;
      oldbase._0_4_ = (int)oldbase + 1;
      if (last <= start) {
        pxVar6 = ctxt->input->base;
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        if (pxVar6 != ctxt->input->base) {
          lVar5 = (long)ctxt->input->base - (long)pxVar6;
          end = end + lVar5;
          start = start + lVar5;
        }
        last = ctxt->input->end;
        if ((10000000 < (long)start - (long)end) && ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
          return (xmlChar *)0x0;
        }
      }
    }
    ret._0_4_ = (int)start;
    if ((10000000 < (long)start - (long)end) && ((ctxt->options & 0x80000U) == 0)) {
      xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
      return (xmlChar *)0x0;
    }
    xVar2 = *start;
    _col = end;
  }
  else {
    while( true ) {
      end = start;
      bVar7 = false;
      if ((((start < last) && (bVar7 = false, *start != xVar1)) && (bVar7 = true, *start != ' ')) &&
         ((bVar7 = true, *start != '\t' && (bVar7 = true, *start != '\n')))) {
        bVar7 = *start == '\r';
      }
      if (!bVar7) break;
      if (*start == '\n') {
        oldbase._4_4_ = oldbase._4_4_ + 1;
        oldbase._0_4_ = 1;
      }
      else {
        oldbase._0_4_ = (int)oldbase + 1;
      }
      start = start + 1;
      if (last <= start) {
        pxVar6 = ctxt->input->base;
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        if (pxVar6 != ctxt->input->base) {
          start = start + ((long)ctxt->input->base - (long)pxVar6);
        }
        last = ctxt->input->end;
      }
    }
    while( true ) {
      bVar7 = false;
      if (((start < last) && (bVar7 = false, *start != xVar1)) &&
         ((bVar7 = false, 0x1f < *start &&
          ((bVar7 = false, *start < 0x80 && (bVar7 = false, *start != '&')))))) {
        bVar7 = *start != '<';
      }
      if (!bVar7) break;
      oldbase._0_4_ = (int)oldbase + 1;
      pxVar6 = start + 1;
      if ((*start == ' ') && (start = pxVar6, *pxVar6 == ' ')) break;
      start = pxVar6;
      if (last <= pxVar6) {
        pxVar4 = ctxt->input->base;
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        if (pxVar4 != ctxt->input->base) {
          lVar5 = (long)ctxt->input->base - (long)pxVar4;
          end = end + lVar5;
          start = pxVar6 + lVar5;
        }
        last = ctxt->input->end;
        if ((10000000 < (long)start - (long)end) && ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
          return (xmlChar *)0x0;
        }
      }
    }
    for (ret = start; ret[-1] == ' ' && end < ret; ret = ret + -1) {
    }
    while( true ) {
      bVar7 = false;
      if ((((start < last) && (bVar7 = false, *start != xVar1)) && (bVar7 = true, *start != ' ')) &&
         ((bVar7 = true, *start != '\t' && (bVar7 = true, *start != '\n')))) {
        bVar7 = *start == '\r';
      }
      if (!bVar7) break;
      if (*start == '\n') {
        oldbase._4_4_ = oldbase._4_4_ + 1;
        oldbase._0_4_ = 1;
      }
      else {
        oldbase._0_4_ = (int)oldbase + 1;
      }
      start = start + 1;
      if (last <= start) {
        pxVar6 = ctxt->input->base;
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        if (ctxt->instate == XML_PARSER_EOF) {
          return (xmlChar *)0x0;
        }
        if (pxVar6 != ctxt->input->base) {
          lVar5 = (long)ctxt->input->base - (long)pxVar6;
          end = end + lVar5;
          start = start + lVar5;
          ret = ret + lVar5;
        }
        last = ctxt->input->end;
        if ((10000000 < (long)start - (long)end) && ((ctxt->options & 0x80000U) == 0)) {
          xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
          return (xmlChar *)0x0;
        }
      }
    }
    if ((10000000 < (long)start - (long)end) && ((ctxt->options & 0x80000U) == 0)) {
      xmlFatalErrMsg(ctxt,XML_ERR_ATTRIBUTE_NOT_FINISHED,"AttValue length too long\n");
      return (xmlChar *)0x0;
    }
    xVar2 = *start;
    _col = end;
  }
  if (xVar2 != xVar1) {
    if (alloc != (int *)0x0) {
      *alloc = 1;
    }
    pxVar6 = xmlParseAttValueComplex(ctxt,len,normalize);
    return pxVar6;
  }
  if (len == (int *)0x0) {
    if (alloc != (int *)0x0) {
      *alloc = 1;
    }
    _col = xmlStrndup(_col,(int)ret - (int)_col);
  }
  else {
    *len = (int)ret - (int)_col;
  }
  ctxt->input->cur = start + 1;
  ctxt->input->line = oldbase._4_4_;
  ctxt->input->col = (int)oldbase + 1;
  if (alloc != (int *)0x0) {
    *alloc = 0;
  }
  return _col;
}

Assistant:

static xmlChar *
xmlParseAttValueInternal(xmlParserCtxtPtr ctxt, int *len, int *alloc,
                         int normalize)
{
    xmlChar limit = 0;
    const xmlChar *in = NULL, *start, *end, *last;
    xmlChar *ret = NULL;
    int line, col;

    GROW;
    in = (xmlChar *) CUR_PTR;
    line = ctxt->input->line;
    col = ctxt->input->col;
    if (*in != '"' && *in != '\'') {
        xmlFatalErr(ctxt, XML_ERR_ATTRIBUTE_NOT_STARTED, NULL);
        return (NULL);
    }
    ctxt->instate = XML_PARSER_ATTRIBUTE_VALUE;

    /*
     * try to handle in this routine the most common case where no
     * allocation of a new string is required and where content is
     * pure ASCII.
     */
    limit = *in++;
    col++;
    end = ctxt->input->end;
    start = in;
    if (in >= end) {
        GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
    }
    if (normalize) {
        /*
	 * Skip any leading spaces
	 */
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++; col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    start = in;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    col++;
	    if ((*in++ == 0x20) && (*in == 0x20)) break;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
	/*
	 * skip the trailing blanks
	 */
	while ((last[-1] == 0x20) && (last > start)) last--;
	while ((in < end) && (*in != limit) &&
	       ((*in == 0x20) || (*in == 0x9) ||
	        (*in == 0xA) || (*in == 0xD))) {
	    if (*in == 0xA) {
	        line++, col = 1;
	    } else {
	        col++;
	    }
	    in++;
	    if (in >= end) {
		const xmlChar *oldbase = ctxt->input->base;
		GROW;
                if (ctxt->instate == XML_PARSER_EOF)
                    return(NULL);
		if (oldbase != ctxt->input->base) {
		    ptrdiff_t delta = ctxt->input->base - oldbase;
		    start = start + delta;
		    in = in + delta;
		    last = last + delta;
		}
		end = ctxt->input->end;
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    } else {
	while ((in < end) && (*in != limit) && (*in >= 0x20) &&
	       (*in <= 0x7f) && (*in != '&') && (*in != '<')) {
	    in++;
	    col++;
	    if (in >= end) {
                GROW_PARSE_ATT_VALUE_INTERNAL(ctxt, in, start, end)
                if (((in - start) > XML_MAX_TEXT_LENGTH) &&
                    ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                                   "AttValue length too long\n");
                    return(NULL);
                }
	    }
	}
	last = in;
        if (((in - start) > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsg(ctxt, XML_ERR_ATTRIBUTE_NOT_FINISHED,
                           "AttValue length too long\n");
            return(NULL);
        }
	if (*in != limit) goto need_complex;
    }
    in++;
    col++;
    if (len != NULL) {
        *len = last - start;
        ret = (xmlChar *) start;
    } else {
        if (alloc) *alloc = 1;
        ret = xmlStrndup(start, last - start);
    }
    CUR_PTR = in;
    ctxt->input->line = line;
    ctxt->input->col = col;
    if (alloc) *alloc = 0;
    return ret;
need_complex:
    if (alloc) *alloc = 1;
    return xmlParseAttValueComplex(ctxt, len, normalize);
}